

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

string * __thiscall
dynamicgraph::command::Value::stringValue_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_3d;
  int local_3c;
  string local_38;
  
  if (this->type_ == STRING) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->value_);
    return __return_storage_ptr__;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_3c = 700;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"value is not an string",&local_3d);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_3c,&local_38);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

std::string Value::stringValue() const {
  if (type_ == STRING) return *((const std::string *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS, "value is not an string");
}